

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

void __thiscall cnn::Cluster::new_graph(Cluster *this,ComputationGraph *cg)

{
  pointer ppCVar1;
  vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *__range1;
  pointer ppCVar2;
  
  ppCVar1 = (this->children).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->children).
                 super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
    new_graph(*ppCVar2,cg);
  }
  (this->bias).pg = (ComputationGraph *)0x0;
  (this->weights).pg = (ComputationGraph *)0x0;
  return;
}

Assistant:

void Cluster::new_graph(ComputationGraph& cg) {
  for (Cluster* child : children) {
    child->new_graph(cg);
  }
  bias.pg = NULL;
  weights.pg = NULL;
}